

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cproxy.c
# Opt level: O2

void BinarySink_put_hex_data(BinarySink *bs,void *vptr,size_t len)

{
  byte bVar1;
  size_t sVar2;
  
  for (sVar2 = 0; len != sVar2; sVar2 = sVar2 + 1) {
    bVar1 = *(byte *)((long)vptr + sVar2);
    BinarySink_put_byte(bs->binarysink_,"0123456789abcdef"[bVar1 >> 4]);
    BinarySink_put_byte(bs->binarysink_,"0123456789abcdef"[bVar1 & 0xf]);
  }
  return;
}

Assistant:

void BinarySink_put_hex_data(BinarySink *bs, const void *vptr, size_t len)
{
    const unsigned char *p = (const unsigned char *)vptr;
    const char *hexdigits = "0123456789abcdef";
    while (len-- > 0) {
        unsigned c = *p++;
        put_byte(bs, hexdigits[0xF & (c >> 4)]);
        put_byte(bs, hexdigits[0xF & (c     )]);
    }
}